

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.cpp
# Opt level: O3

void push(int argc,char **argv)

{
  pointer pbVar1;
  pointer pcVar2;
  undefined1 *__s1;
  int iVar3;
  int iVar4;
  size_t sVar5;
  undefined8 *puVar6;
  long *plVar7;
  pointer pbVar8;
  size_type *psVar9;
  pointer pbVar10;
  ulong uVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string file;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  client_hashes;
  string server_hash;
  Msg msg;
  undefined1 local_968 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_948;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_938;
  pointer local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_900;
  pointer *local_8e8;
  long local_8e0;
  pointer local_8d8 [2];
  undefined1 *local_8c8;
  size_t local_8c0;
  undefined1 local_8b8 [16];
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  Msg local_804;
  
  if (argc < 2) {
    printf("need 2 arguments");
  }
  iVar3 = atoi(*argv);
  iVar3 = client_start(iVar3,argv[1]);
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_828,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_828,&local_804);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p);
  }
  local_804.type = MSG_PUSH;
  send(iVar3,&local_804,0x7d4,0);
  recv(iVar3,&local_804,0x7d4,0x100);
  if (local_804.type == MSG_END) {
    puts("Repositories not compatible");
    goto LAB_0010b525;
  }
  local_8c8 = local_8b8;
  sVar5 = strlen(local_804.buf2);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8c8,local_804.buf2,local_804.buf2 + sVar5);
  read_all_lines_abi_cxx11_(&local_900,HEAD_abi_cxx11_._M_dataplus._M_p);
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_848,HEAD_abi_cxx11_._M_dataplus._M_p,
             HEAD_abi_cxx11_._M_dataplus._M_p + HEAD_abi_cxx11_._M_string_length);
  fileToMsg(&local_848,&local_804);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  local_804.type = MSG_PULL;
  send(iVar3,&local_804,0x7d4,0);
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_868,LOG_abi_cxx11_._M_dataplus._M_p,
             LOG_abi_cxx11_._M_dataplus._M_p + LOG_abi_cxx11_._M_string_length);
  fileToMsg(&local_868,&local_804);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  send(iVar3,&local_804,0x7d4,0);
  iVar4 = std::__cxx11::string::compare((char *)&local_8c8);
  __s1 = local_8c8;
  if (iVar4 != 0) {
    local_928 = local_900.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    psVar9 = &(local_900.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar12 = 0x100000000;
    do {
      if (local_8c0 == *psVar9) {
        if (local_8c0 == 0) goto LAB_0010b1dc;
        iVar4 = bcmp(__s1,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar9 + -1))->_M_dataplus)._M_p,local_8c0);
        if (iVar4 == 0) goto LAB_0010b1dc;
      }
      lVar12 = lVar12 + 0x100000000;
      psVar9 = psVar9 + 4;
    } while( true );
  }
  pbVar10 = (pointer)0x0;
  pbVar8 = local_900.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
LAB_0010b1ec:
  if (pbVar10 < (pointer)((long)local_900.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
    do {
      local_968._0_8_ = local_968 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_968,COMMITS_DIR_abi_cxx11_._M_dataplus._M_p,
                 COMMITS_DIR_abi_cxx11_._M_dataplus._M_p + COMMITS_DIR_abi_cxx11_._M_string_length);
      std::__cxx11::string::append(local_968);
      local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
      pcVar2 = local_900.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pbVar10]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_8a8,pcVar2,
                 pcVar2 + local_900.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)pbVar10]._M_string_length)
      ;
      deleteEndl(&local_8a8);
      pbVar8 = (pointer)0xf;
      if ((pointer)local_968._0_8_ != (pointer)(local_968 + 0x10)) {
        pbVar8 = (pointer)local_968._16_8_;
      }
      pbVar1 = (pointer)((long)&((_Alloc_hider *)local_968._8_8_)->_M_p + local_8e0);
      if (pbVar8 < pbVar1) {
        pbVar8 = (pointer)0xf;
        if (local_8e8 != local_8d8) {
          pbVar8 = local_8d8[0];
        }
        if (pbVar8 < pbVar1) goto LAB_0010b2ea;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_8e8,0,(char *)0x0,local_968._0_8_);
      }
      else {
LAB_0010b2ea:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_968,(ulong)local_8e8);
      }
      local_948._M_allocated_capacity = (size_type)&local_938;
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_938._M_allocated_capacity = *psVar9;
        local_938._8_8_ = puVar6[3];
      }
      else {
        local_938._M_allocated_capacity = *psVar9;
        local_948._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar6;
      }
      local_948._8_8_ = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)psVar9 = 0;
      plVar7 = (long *)std::__cxx11::string::append(local_948._M_local_buf);
      local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_920.field_2._M_allocated_capacity = *psVar9;
        local_920.field_2._8_8_ = plVar7[3];
      }
      else {
        local_920.field_2._M_allocated_capacity = *psVar9;
        local_920._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_920._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_948._M_allocated_capacity != &local_938) {
        operator_delete((void *)local_948._M_allocated_capacity);
      }
      if (local_8e8 != local_8d8) {
        operator_delete(local_8e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
        operator_delete(local_8a8._M_dataplus._M_p);
      }
      local_928 = pbVar10;
      if ((pointer)local_968._0_8_ != (pointer)(local_968 + 0x10)) {
        operator_delete((void *)local_968._0_8_);
      }
      ls_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_968,local_920._M_dataplus._M_p);
      if (local_968._8_8_ != local_968._0_8_) {
        lVar12 = 0;
        uVar11 = 0;
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_948,&local_920,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((_Alloc_hider *)local_968._0_8_)->_M_p + lVar12));
          local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_888,local_948._M_allocated_capacity,
                     (char *)(local_948._M_allocated_capacity + local_948._8_8_));
          fileToMsg(&local_888,&local_804);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_888._M_dataplus._M_p != &local_888.field_2) {
            operator_delete(local_888._M_dataplus._M_p);
          }
          local_804.type = MSG_PULL;
          send(iVar3,&local_804,0x7d4,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_948._M_allocated_capacity != &local_938) {
            operator_delete((void *)local_948._M_allocated_capacity);
          }
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 0x20;
        } while (uVar11 < (ulong)((long)(local_968._8_8_ - local_968._0_8_) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_968);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920._M_dataplus._M_p != &local_920.field_2) {
        operator_delete(local_920._M_dataplus._M_p);
      }
      pbVar10 = (pointer)((long)&(local_928->_M_dataplus)._M_p + 1);
    } while (pbVar10 < (pointer)((long)local_900.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_900.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_900);
  if (local_8c8 != local_8b8) {
    operator_delete(local_8c8);
  }
LAB_0010b525:
  client_stop();
  return;
LAB_0010b1dc:
  pbVar10 = (pointer)(lVar12 >> 0x20);
  pbVar8 = local_928;
  goto LAB_0010b1ec;
}

Assistant:

void push(int argc, char *argv[]){
    if(argc < 2){
        printf("need 2 arguments");
    }
    int port = atoi(argv[0]);
    char *address = argv[1];
    int sock = client_start(port,address);

    Msg msg;
    fileToMsg(HEAD,msg);
    msg.type = MSG_PUSH;
    send(sock,&msg,sizeof(msg),0);
    recv(sock, &msg, sizeof(msg), MSG_WAITALL);
    if(msg.type != MSG_END){
        String server_hash = msg.buf2;
        Vector<String> client_hashes = read_all_lines(HEAD.c_str());
        fileToMsg(HEAD,msg);
        msg.type = MSG_PULL;
        send(sock,&msg,sizeof(msg),0);
        fileToMsg(LOG,msg);
        send(sock,&msg,sizeof(msg),0);
        int i = 0;
        if(server_hash != ""){
            while(server_hash != client_hashes[i]){
                i++;
            }
            i++;
        }
        while(i<client_hashes.size()){
            String dir = COMMITS_DIR + "/" + deleteEndl(client_hashes[i]) + "/";
            Vector<String> files = ls(dir.c_str());
            for(int j = 0; j < files.size();j++){
                String file = dir + files[j];
                fileToMsg(file,msg);
                msg.type = MSG_PULL;
                send(sock,&msg,sizeof(msg),0);
            }
            i++;
        }
    }
    else{
        printf("Repositories not compatible\n");
    }
    client_stop();
}